

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall ctemplate::TemplateCache::Delete(TemplateCache *this,TemplateString *key)

{
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  *this_00;
  bool bVar1;
  TemplateId TVar2;
  pointer ppVar3;
  reference __x;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_80;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_78;
  iterator it_1;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
  local_68;
  iterator it;
  TemplateId key_id;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> to_erase;
  WriterMutexLock local_28;
  WriterMutexLock ml;
  TemplateString *key_local;
  TemplateCache *this_local;
  
  ml.mu_ = (Mutex *)key;
  WriterMutexLock::WriterMutexLock(&local_28,this->mutex_);
  if ((this->is_frozen_ & 1U) == 0) {
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *
           )&key_id);
    TVar2 = TemplateString::GetGlobalId((TemplateString *)ml.mu_);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
         ::begin(this->parsed_template_cache_);
    while( true ) {
      it_1._M_current =
           (pair<unsigned_long,_int> *)
           std::
           unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
           ::end(this->parsed_template_cache_);
      bVar1 = std::__detail::operator!=
                        (&local_68,
                         (_Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                          *)&it_1);
      if (!bVar1) break;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                             *)&local_68);
      if ((ppVar3->first).first == TVar2) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                               *)&local_68);
        RefcountedTemplate::DecRef((ppVar3->second).refcounted_tpl);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                               *)&local_68);
        std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
        ::push_back((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     *)&key_id,&ppVar3->first);
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                    *)&local_68);
    }
    local_78._M_current =
         (pair<unsigned_long,_int> *)
         std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
         ::begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                  *)&key_id);
    while( true ) {
      local_80._M_current =
           (pair<unsigned_long,_int> *)
           std::
           vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
           end((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                *)&key_id);
      bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
      if (!bVar1) break;
      this_00 = this->parsed_template_cache_;
      __x = __gnu_cxx::
            __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
            ::operator*(&local_78);
      std::
      unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
      ::erase(this_00,__x);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
      ::operator++(&local_78);
    }
    bVar1 = std::
            vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
            empty((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                   *)&key_id);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    to_erase.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    ~vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
             *)&key_id);
  }
  else {
    this_local._7_1_ = false;
    to_erase.
    super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  WriterMutexLock::~WriterMutexLock(&local_28);
  return this_local._7_1_;
}

Assistant:

bool TemplateCache::Delete(const TemplateString& key) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // Cannot delete from a frozen cache.
    return false;
  }
  vector<TemplateCacheKey> to_erase;
  const TemplateId key_id = key.GetGlobalId();
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();  ++it) {
    if (it->first.first == key_id) {
      // We'll delete the content pointed to by the entry here, since
      // it's handy, but we won't delete the entry itself quite yet.
      it->second.refcounted_tpl->DecRef();
      to_erase.push_back(it->first);
    }
  }
  for (vector<TemplateCacheKey>::iterator it = to_erase.begin();
       it != to_erase.end(); ++it) {
    parsed_template_cache_->erase(*it);
  }
  return !to_erase.empty();
}